

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

bool __thiscall QTextEdit::event(QTextEdit *this,QEvent *e)

{
  QEvent QVar1;
  ushort uVar2;
  long lVar3;
  QTextEditPrivate *this_00;
  QWidgetTextControl *this_01;
  bool bVar4;
  QPalette *pal;
  QTextEditPrivate *d;
  long in_FS_OFFSET;
  QRect QVar5;
  QPoint local_88;
  QPoint local_80;
  QContextMenuEvent ce;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  uVar2 = *(ushort *)(e + 8);
  if (uVar2 - 0x18 < 2) {
    this_01 = (QWidgetTextControl *)this_00->control;
    pal = QWidget::palette((QWidget *)this);
    QWidgetTextControl::setPalette(this_01,pal);
  }
  else if (uVar2 == 0x6e) {
LAB_0046079d:
    QTextEditPrivate::sendControlEvent(this_00,e);
  }
  else if (uVar2 == 0x52) {
    if (e[0x38] == (QEvent)0x1) {
      (**(code **)(*(long *)this_00->control + 0x60))();
      QVar5 = cursorRect(this);
      local_80 = (QPoint)(((long)QVar5.x2.m_i.m_i + (long)QVar5.x1.m_i.m_i) / 2 & 0xffffffffU |
                         ((QVar5._8_8_ >> 0x20) + (QVar5._0_8_ >> 0x20)) / 2 << 0x20);
      _ce = &DAT_aaaaaaaaaaaaaaaa;
      local_88 = QWidget::mapToGlobal
                           ((this_00->super_QAbstractScrollAreaPrivate).viewport,&local_80);
      QContextMenuEvent::QContextMenuEvent(&ce,1,&local_80,&local_88,0);
      QVar1 = e[0xc];
      bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,(QEvent *)&ce);
      (**(code **)(*(long *)e + 0x10))(e,QVar1);
      QContextMenuEvent::~QContextMenuEvent(&ce);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
        return bVar4;
      }
      goto LAB_004608e2;
    }
  }
  else if (uVar2 == 0x33) goto LAB_0046079d;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    bVar4 = QAbstractScrollArea::event((QAbstractScrollArea *)this,e);
    return bVar4;
  }
LAB_004608e2:
  __stack_chk_fail();
}

Assistant:

bool QTextEdit::event(QEvent *e)
{
    Q_D(QTextEdit);
    switch (e->type()) {
    case QEvent::ShortcutOverride:
    case QEvent::ToolTip:
        d->sendControlEvent(e);
        break;
    case QEvent::WindowActivate:
    case QEvent::WindowDeactivate:
        d->control->setPalette(palette());
        break;
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard) {
            ensureCursorVisible();
            const QPoint cursorPos = cursorRect().center();
            QContextMenuEvent ce(QContextMenuEvent::Keyboard, cursorPos, d->viewport->mapToGlobal(cursorPos));
            ce.setAccepted(e->isAccepted());
            const bool result = QAbstractScrollArea::event(&ce);
            e->setAccepted(ce.isAccepted());
            return result;
        }
        break;
#endif // QT_NO_CONTEXTMENU
#ifdef QT_KEYPAD_NAVIGATION
    case QEvent::EnterEditFocus:
    case QEvent::LeaveEditFocus:
        if (QApplicationPrivate::keypadNavigationEnabled())
            d->sendControlEvent(e);
        break;
#endif
    default:
        break;
    }
    return QAbstractScrollArea::event(e);
}